

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUuid.cxx
# Opt level: O0

string * __thiscall
cmUuid::FromMd5(string *__return_storage_ptr__,cmUuid *this,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *uuidNamespace,string *name)

{
  undefined8 md5_00;
  reference data;
  size_type sVar1;
  uchar auStack_68 [8];
  uchar digest [16];
  cmsysMD5_s *md5;
  undefined1 local_40 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> hashInput;
  string *name_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *uuidNamespace_local;
  cmUuid *this_local;
  
  hashInput.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)name;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  CreateHashInput(this,uuidNamespace,
                  (string *)
                  hashInput.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  digest._8_8_ = cmsysMD5_New();
  cmsysMD5_Initialize((cmsysMD5 *)digest._8_8_);
  md5_00 = digest._8_8_;
  data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0);
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  cmsysMD5_Append((cmsysMD5 *)md5_00,data,(int)sVar1);
  auStack_68[0] = '\0';
  auStack_68[1] = '\0';
  auStack_68[2] = '\0';
  auStack_68[3] = '\0';
  auStack_68[4] = '\0';
  auStack_68[5] = '\0';
  auStack_68[6] = '\0';
  auStack_68[7] = '\0';
  digest[0] = '\0';
  digest[1] = '\0';
  digest[2] = '\0';
  digest[3] = '\0';
  digest[4] = '\0';
  digest[5] = '\0';
  digest[6] = '\0';
  digest[7] = '\0';
  cmsysMD5_Finalize((cmsysMD5 *)digest._8_8_,auStack_68);
  cmsysMD5_Delete((cmsysMD5 *)digest._8_8_);
  FromDigest_abi_cxx11_(__return_storage_ptr__,this,auStack_68,'\x03');
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string cmUuid::FromMd5(std::vector<unsigned char> const& uuidNamespace,
  std::string const& name) const
{
  std::vector<unsigned char> hashInput;
  this->CreateHashInput(uuidNamespace, name, hashInput);

  cmsysMD5_s *md5 = cmsysMD5_New();
  cmsysMD5_Initialize(md5);
  cmsysMD5_Append(md5, &hashInput[0], int(hashInput.size()));

  unsigned char digest[16] = {0};
  cmsysMD5_Finalize(md5, digest);

  cmsysMD5_Delete(md5);

  return this->FromDigest(digest, 3);
}